

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpTools.cpp
# Opt level: O2

bool __thiscall UdpTools::bindSocketToInterface(UdpTools *this,int sd,string *interfaceName)

{
  int iVar1;
  ifreq ifr;
  
  ifr.ifr_ifru.ifru_map.mem_start = 0;
  ifr.ifr_ifru.ifru_map.mem_end = 0;
  ifr.ifr_ifrn._0_8_ = 0;
  ifr.ifr_ifrn._8_8_ = 0;
  ifr.ifr_ifru._16_8_ = 0;
  snprintf((char *)&ifr,0x10,"%s",(interfaceName->_M_dataplus)._M_p);
  iVar1 = setsockopt(sd,1,0x19,&ifr,0x28);
  if (iVar1 < 0) {
    perror("Server-setsockopt() error for SO_BINDTODEVICE");
  }
  return -1 < iVar1;
}

Assistant:

bool UdpTools::bindSocketToInterface(int sd, std::string interfaceName)
{
	/*Bind socket to a specific interface if set*/
	struct ifreq ifr;
	memset(&ifr, 0, sizeof(ifr));
	snprintf(ifr.ifr_name, sizeof(ifr.ifr_name), "%s", interfaceName.c_str());

	if ((setsockopt(sd, SOL_SOCKET, SO_BINDTODEVICE, (void *)&ifr, sizeof(ifr))) < 0)
	{
		perror("Server-setsockopt() error for SO_BINDTODEVICE");
		return false;
	}
	else
	{
		return true;
	}


}